

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.h
# Opt level: O3

void __thiscall shift_window_transformer::Linear<float>::~Linear(Linear<float> *this)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  pointer pfVar2;
  
  (this->super_Layer<float>)._vptr_Layer = (_func_int **)&PTR_forward_0010b9f0;
  pvVar1 = this->weights;
  if (pvVar1 != (vector<float,_std::allocator<float>_> *)0x0) {
    pfVar2 = (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pfVar2 != (pointer)0x0) {
      operator_delete(pfVar2,(long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar2)
      ;
    }
    operator_delete(pvVar1,0x18);
    this->weights = (vector<float,_std::allocator<float>_> *)0x0;
  }
  pvVar1 = this->bias;
  if (pvVar1 != (vector<float,_std::allocator<float>_> *)0x0) {
    pfVar2 = (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pfVar2 != (pointer)0x0) {
      operator_delete(pfVar2,(long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar2)
      ;
    }
    operator_delete(pvVar1,0x18);
    this->bias = (vector<float,_std::allocator<float>_> *)0x0;
  }
  return;
}

Assistant:

~Linear() {
            if (weights != nullptr) {
                delete weights;
                weights = nullptr;
            }
            if (bias != nullptr) {
                delete bias;
                bias = nullptr;
            }
        }